

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O1

void Omega_h::migrate_mesh(Mesh *mesh,Dist *new_elems2old_owners,Omega_h_Parting mode,bool verbose)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var1;
  int *piVar2;
  void **ppvVar3;
  Alloc *pAVar4;
  element_type *peVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  LO LVar9;
  I32 IVar10;
  long *plVar11;
  undefined8 *puVar12;
  ostream *poVar13;
  undefined7 in_register_00000009;
  Alloc *pAVar14;
  LO msg;
  int iVar15;
  long lVar16;
  Alloc *pAVar17;
  char *__end;
  char *__end_1;
  ScopedTimer omega_h_scoped_function_timer;
  CommPtr comm;
  HostRead<int> msgs2ranks_h;
  Dist new_ents2old_owners;
  Dist new_verts2old_owners;
  Dist old_owners2new_ents;
  LOs msg_content_size;
  Mesh new_mesh;
  ScopedTimer local_a61;
  int local_a60;
  Omega_h_Parting local_a5c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a58;
  Dist *local_a50;
  Adj local_a48;
  Comm *local_a18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a10;
  Read<signed_char> local_a08;
  HostRead<int> local_9f8;
  Read<signed_char> local_9e8;
  Adj local_9d8;
  undefined1 local_9a8 [144];
  undefined1 local_918 [144];
  undefined1 local_888 [144];
  undefined1 local_7f8 [144];
  Dist local_768;
  Dist local_6d8;
  Dist local_648;
  Mesh local_5b8;
  Dist local_1e0;
  Dist local_150;
  Dist local_c0;
  
  local_a5c = mode;
  local_a50 = new_elems2old_owners;
  local_888._0_8_ = (element_type *)(local_888 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_888,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_migrate.cpp"
             ,"");
  plVar11 = (long *)std::__cxx11::string::append(local_888);
  pAVar4 = (Alloc *)(local_9a8 + 0x10);
  pAVar14 = (Alloc *)(plVar11 + 2);
  if ((Alloc *)*plVar11 == pAVar14) {
    local_9a8._16_8_ = pAVar14->size;
    local_9a8._24_8_ = plVar11[3];
    local_9a8._0_8_ = pAVar4;
  }
  else {
    local_9a8._16_8_ = pAVar14->size;
    local_9a8._0_8_ = (Alloc *)*plVar11;
  }
  local_9a8._8_8_ = plVar11[1];
  *plVar11 = (long)pAVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  peVar5 = (element_type *)(local_918 + 0x10);
  local_918._0_8_ = peVar5;
  std::__cxx11::string::_M_construct((ulong)local_918,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_918._0_8_,3,0xc3);
  pAVar14 = (Alloc *)((long)(_func_int ***)local_9a8._8_8_ + (long)(_func_int ***)local_918._8_8_);
  pAVar17 = (Alloc *)0xf;
  if ((Alloc *)local_9a8._0_8_ != pAVar4) {
    pAVar17 = (Alloc *)local_9a8._16_8_;
  }
  if (pAVar17 < pAVar14) {
    pAVar17 = (Alloc *)0xf;
    if ((element_type *)local_918._0_8_ != peVar5) {
      pAVar17 = (Alloc *)local_918._16_8_;
    }
    if (pAVar14 <= pAVar17) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_918,0,(char *)0x0,local_9a8._0_8_);
      goto LAB_00375b15;
    }
  }
  puVar12 = (undefined8 *)std::__cxx11::string::_M_append(local_9a8,local_918._0_8_);
LAB_00375b15:
  local_5b8._0_8_ =
       &local_5b8.comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  pp_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)(puVar12 + 2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)*puVar12 == pp_Var1) {
    local_5b8.comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*pp_Var1;
    local_5b8._24_8_ = puVar12[3];
  }
  else {
    local_5b8.comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*pp_Var1;
    local_5b8._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)*puVar12;
  }
  local_5b8.comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)puVar12[1];
  *puVar12 = pp_Var1;
  local_a60 = (int)CONCAT71(in_register_00000009,verbose);
  puVar12[1] = 0;
  *(undefined1 *)pp_Var1 = 0;
  begin_code("migrate_mesh",(char *)local_5b8._0_8_);
  pp_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
            &local_5b8.comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_5b8._0_8_ != pp_Var1) {
    operator_delete((void *)local_5b8._0_8_,
                    (ulong)((long)local_5b8.comm_.
                                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 1));
  }
  if ((element_type *)local_918._0_8_ != peVar5) {
    operator_delete((void *)local_918._0_8_,(ulong)((long)(size_t *)local_918._16_8_ + 1));
  }
  if ((Alloc *)local_9a8._0_8_ != pAVar4) {
    operator_delete((void *)local_9a8._0_8_,local_9a8._16_8_ + 1);
  }
  if ((element_type *)local_888._0_8_ != (element_type *)(local_888 + 0x10)) {
    operator_delete((void *)local_888._0_8_,(ulong)((long)(size_t *)local_888._16_8_ + 1));
  }
  uVar8 = mesh->dim_;
  if (uVar8 < 4) {
    iVar15 = 0;
    do {
      if ((int)uVar8 < iVar15) {
        Mesh::copy_meta(&local_5b8,mesh);
        Mesh::comm(mesh);
        uVar8 = mesh->dim_;
        if (3 < uVar8) {
          fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
               ,0x33);
        }
        if ((char)local_a60 != '\0') {
          if (local_a10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_a10->_M_use_count = local_a10->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_a10->_M_use_count = local_a10->_M_use_count + 1;
            }
          }
          local_a58 = local_a10;
          Dist::Dist(&local_768,local_a50);
          Dist::msgs2ranks((Dist *)local_888);
          Dist::msgs2content(&local_768);
          local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_918._0_8_;
          if ((local_918._0_8_ & 7) == 0 && (element_type *)local_918._0_8_ != (element_type *)0x0)
          {
            if (entering_parallel == '\x01') {
              local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((long)*(Library **)local_918._0_8_ * 8 + 1);
            }
            else {
              ppvVar3 = &(((HostRead<int> *)(local_918._0_8_ + 0x28))->read_).write_.shared_alloc_.
                         direct_ptr;
              *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
            }
          }
          local_a48.super_Graph.a2ab.write_.shared_alloc_.direct_ptr = (void *)local_918._8_8_;
          local_9a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_9a8._16_8_ = local_9a8._16_8_ & 0xffffffffffffff00;
          local_9a8._0_8_ = (Alloc *)(local_9a8 + 0x10);
          get_degrees((Omega_h *)local_7f8,(LOs *)&local_a48,(string *)local_9a8);
          if ((Alloc *)local_9a8._0_8_ != (Alloc *)(local_9a8 + 0x10)) {
            operator_delete((void *)local_9a8._0_8_,local_9a8._16_8_ + 1);
          }
          pAVar4 = local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            ppvVar3 = &(((HostRead<int> *)
                        &(local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc)->ptr)->read_).
                       write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
            if (*(int *)ppvVar3 == 0) {
              Alloc::~Alloc(local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          local_9e8.write_.shared_alloc_.alloc = (Alloc *)local_7f8._0_8_;
          if ((local_7f8._0_8_ & 7) == 0 && (element_type *)local_7f8._0_8_ != (element_type *)0x0)
          {
            if (entering_parallel == '\x01') {
              local_9e8.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_7f8._0_8_ * 8 + 1);
            }
            else {
              *(int *)(local_7f8._0_8_ + 0x30) = *(int *)(local_7f8._0_8_ + 0x30) + 1;
            }
          }
          local_9e8.write_.shared_alloc_.direct_ptr = (void *)local_7f8._8_8_;
          HostRead<int>::HostRead((HostRead<int> *)local_9a8,&local_9e8);
          pAVar4 = local_9e8.write_.shared_alloc_.alloc;
          if (((ulong)local_9e8.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_9e8.write_.shared_alloc_.alloc != (element_type *)0x0) {
            ppvVar3 = &(((HostRead<int> *)&(local_9e8.write_.shared_alloc_.alloc)->ptr)->read_).
                       write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
            if (*(int *)ppvVar3 == 0) {
              Alloc::~Alloc(local_9e8.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          local_a08.write_.shared_alloc_.alloc = (Alloc *)local_888._0_8_;
          if ((local_888._0_8_ & 7) == 0 && (element_type *)local_888._0_8_ != (element_type *)0x0)
          {
            if (entering_parallel == '\x01') {
              local_a08.write_.shared_alloc_.alloc =
                   (Alloc *)((long)*(Library **)local_888._0_8_ * 8 + 1);
            }
            else {
              ppvVar3 = &(((HostRead<int> *)(local_888._0_8_ + 0x28))->read_).write_.shared_alloc_.
                         direct_ptr;
              *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
            }
          }
          local_a08.write_.shared_alloc_.direct_ptr = (void *)local_888._8_8_;
          HostRead<int>::HostRead(&local_9f8,&local_a08);
          pAVar4 = local_a08.write_.shared_alloc_.alloc;
          if (((ulong)local_a08.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_a08.write_.shared_alloc_.alloc != (element_type *)0x0) {
            ppvVar3 = &(((HostRead<int> *)&(local_a08.write_.shared_alloc_.alloc)->ptr)->read_).
                       write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
            if (*(int *)ppvVar3 == 0) {
              Alloc::~Alloc(local_a08.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          lVar16 = 0;
          local_a60 = 0;
          while( true ) {
            LVar9 = HostRead<int>::size(&local_9f8);
            if (LVar9 <= lVar16) break;
            iVar15 = *(int *)((long)local_9f8.read_.write_.shared_alloc_.direct_ptr + lVar16 * 4);
            IVar10 = Comm::rank(local_a18);
            if (iVar15 == IVar10) {
              local_a60 = *(int *)((long)(_func_int ***)local_9a8._8_8_ + lVar16 * 4);
            }
            lVar16 = lVar16 + 1;
          }
          iVar15 = Read<int>::last((Read<int> *)local_918);
          Comm::allreduce<long>(local_a18,(long)iVar15,OMEGA_H_SUM);
          Comm::allreduce<long>(local_a18,(long)(iVar15 - local_a60),OMEGA_H_SUM);
          IVar10 = Comm::rank(local_a18);
          if (IVar10 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"migration pulling (",0x13);
            poVar13 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," remote) / (",0xc);
            poVar13 = std::ostream::_M_insert<long>((long)poVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," total) elements\n",0x11);
          }
          if (((ulong)local_9f8.read_.write_.shared_alloc_.alloc & 7) == 0 &&
              local_9f8.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar2 = &(local_9f8.read_.write_.shared_alloc_.alloc)->use_count;
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc(local_9f8.read_.write_.shared_alloc_.alloc);
              operator_delete(local_9f8.read_.write_.shared_alloc_.alloc,0x48);
            }
          }
          uVar6 = local_9a8._0_8_;
          if ((local_9a8._0_8_ & 7) == 0 && (Alloc *)local_9a8._0_8_ != (Alloc *)0x0) {
            piVar2 = (int *)(local_9a8._0_8_ + 0x30);
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc((Alloc *)local_9a8._0_8_);
              operator_delete((void *)uVar6,0x48);
            }
          }
          uVar6 = local_7f8._0_8_;
          if ((local_7f8._0_8_ & 7) == 0 && (element_type *)local_7f8._0_8_ != (element_type *)0x0)
          {
            ppvVar3 = (void **)(local_7f8._0_8_ + 0x30);
            *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
            if (*(int *)ppvVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_7f8._0_8_);
              operator_delete((void *)uVar6,0x48);
            }
          }
          uVar6 = local_918._0_8_;
          if ((local_918._0_8_ & 7) == 0 && (element_type *)local_918._0_8_ != (element_type *)0x0)
          {
            ppvVar3 = &(((HostRead<int> *)(local_918._0_8_ + 0x28))->read_).write_.shared_alloc_.
                       direct_ptr;
            *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
            if (*(int *)ppvVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_918._0_8_);
              operator_delete((void *)uVar6,0x48);
            }
          }
          uVar6 = local_888._0_8_;
          if ((local_888._0_8_ & 7) == 0 && (element_type *)local_888._0_8_ != (element_type *)0x0)
          {
            ppvVar3 = &(((HostRead<int> *)(local_888._0_8_ + 0x28))->read_).write_.shared_alloc_.
                       direct_ptr;
            *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
            if (*(int *)ppvVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_888._0_8_);
              operator_delete((void *)uVar6,0x48);
            }
          }
          Dist::~Dist(&local_768);
          if (local_a58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a58);
          }
        }
        Dist::Dist((Dist *)local_9a8,local_a50);
        Dist::invert((Dist *)local_888,(Dist *)local_9a8);
        if (uVar8 != 0) {
          do {
            local_a48.codes.write_.shared_alloc_.alloc = (Alloc *)0x0;
            local_a48.codes.write_.shared_alloc_.direct_ptr = (void *)0x0;
            local_a48.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)0x0;
            local_a48.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)0x0;
            local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)0x0;
            local_a48.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            Dist::Dist((Dist *)local_918);
            Dist::Dist(&local_150,(Dist *)local_888);
            push_down(mesh,uVar8,uVar8 - 1,&local_150,&local_a48,(Dist *)local_918);
            Dist::~Dist(&local_150);
            local_9d8.super_Graph.a2ab.write_.shared_alloc_.alloc =
                 local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc;
            if (((ulong)local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
                (element_type *)local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc !=
                (element_type *)0x0) {
              if (entering_parallel == '\x01') {
                local_9d8.super_Graph.a2ab.write_.shared_alloc_.alloc =
                     (Alloc *)((long)(local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc)->size *
                               8 + 1);
              }
              else {
                ppvVar3 = &(((HostRead<int> *)
                            &(local_a48.super_Graph.a2ab.write_.shared_alloc_.alloc)->ptr)->read_).
                           write_.shared_alloc_.direct_ptr;
                *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
              }
            }
            local_9d8.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
                 local_a48.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
            local_9d8.super_Graph.ab2b.write_.shared_alloc_.alloc =
                 local_a48.super_Graph.ab2b.write_.shared_alloc_.alloc;
            if (((ulong)local_a48.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
                local_a48.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              if (entering_parallel == '\x01') {
                local_9d8.super_Graph.ab2b.write_.shared_alloc_.alloc =
                     (Alloc *)((local_a48.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1
                              );
              }
              else {
                (local_a48.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
                     (local_a48.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
              }
            }
            local_9d8.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
                 local_a48.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
            local_9d8.codes.write_.shared_alloc_.alloc = local_a48.codes.write_.shared_alloc_.alloc;
            if (((ulong)local_a48.codes.write_.shared_alloc_.alloc & 7) == 0 &&
                local_a48.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              if (entering_parallel == '\x01') {
                local_9d8.codes.write_.shared_alloc_.alloc =
                     (Alloc *)((local_a48.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
              }
              else {
                (local_a48.codes.write_.shared_alloc_.alloc)->use_count =
                     (local_a48.codes.write_.shared_alloc_.alloc)->use_count + 1;
              }
            }
            local_9d8.codes.write_.shared_alloc_.direct_ptr =
                 local_a48.codes.write_.shared_alloc_.direct_ptr;
            Mesh::set_ents(&local_5b8,uVar8,&local_9d8);
            Adj::~Adj(&local_9d8);
            Dist::invert((Dist *)local_7f8,(Dist *)local_888);
            Dist::operator=((Dist *)local_9a8,(Dist *)local_7f8);
            Dist::~Dist((Dist *)local_7f8);
            Dist::Dist(&local_1e0,(Dist *)local_9a8);
            Dist::Dist(&local_c0,(Dist *)local_888);
            push_ents(mesh,&local_5b8,uVar8,&local_1e0,&local_c0,local_a5c);
            Dist::~Dist(&local_c0);
            Dist::~Dist(&local_1e0);
            Dist::operator=((Dist *)local_888,(Dist *)local_918);
            Dist::~Dist((Dist *)local_918);
            Adj::~Adj(&local_a48);
            bVar7 = 1 < (int)uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar7);
        }
        Dist::invert((Dist *)local_918,(Dist *)local_888);
        LVar9 = Dist::nitems((Dist *)local_918);
        Mesh::set_verts(&local_5b8,LVar9);
        Dist::Dist(&local_648,(Dist *)local_918);
        Dist::Dist(&local_6d8,(Dist *)local_888);
        push_ents(mesh,&local_5b8,0,&local_648,&local_6d8,local_a5c);
        Dist::~Dist(&local_6d8);
        Dist::~Dist(&local_648);
        Mesh::operator=(mesh,&local_5b8);
        uVar8 = mesh->dim_;
        if (uVar8 < 4) {
          iVar15 = 0;
          do {
            if ((int)uVar8 < iVar15) {
              Dist::~Dist((Dist *)local_918);
              Dist::~Dist((Dist *)local_888);
              Dist::~Dist((Dist *)local_9a8);
              if (local_a10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a10);
              }
              Mesh::~Mesh(&local_5b8);
              ScopedTimer::~ScopedTimer(&local_a61);
              return;
            }
            local_7f8._0_8_ = (element_type *)(local_7f8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_7f8,"global","");
            bVar7 = Mesh::has_tag(mesh,iVar15,(string *)local_7f8);
            if (!bVar7) {
              fail("assertion %s failed at %s +%d\n","mesh->has_tag(d, \"global\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_migrate.cpp"
                   ,0xdf);
            }
            if ((element_type *)local_7f8._0_8_ != (element_type *)(local_7f8 + 0x10)) {
              operator_delete((void *)local_7f8._0_8_,(ulong)(local_7f8._16_8_ + 1));
            }
            iVar15 = iVar15 + 1;
            uVar8 = mesh->dim_;
          } while (uVar8 < 4);
        }
        fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
             ,0x33);
      }
      local_5b8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"global","");
      bVar7 = Mesh::has_tag(mesh,iVar15,(string *)&local_5b8);
      if (!bVar7) {
        fail("assertion %s failed at %s +%d\n","mesh->has_tag(d, \"global\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_migrate.cpp"
             ,0xc5);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_5b8._0_8_ != pp_Var1) {
        operator_delete((void *)local_5b8._0_8_,
                        (ulong)((long)local_5b8.comm_.
                                      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 1));
      }
      iVar15 = iVar15 + 1;
      uVar8 = mesh->dim_;
    } while (uVar8 < 4);
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

void migrate_mesh(
    Mesh* mesh, Dist new_elems2old_owners, Omega_h_Parting mode, bool verbose) {
  OMEGA_H_TIME_FUNCTION;
  for (Int d = 0; d <= mesh->dim(); ++d) {
    OMEGA_H_CHECK(mesh->has_tag(d, "global"));
  }
  auto new_mesh = mesh->copy_meta();
  auto comm = mesh->comm();
  auto dim = mesh->dim();
  if (verbose) print_migrate_stats(comm, new_elems2old_owners);
  Dist new_ents2old_owners = new_elems2old_owners;
  auto old_owners2new_ents = new_ents2old_owners.invert();
  for (Int d = dim; d > VERT; --d) {
    Adj high2low;
    Dist old_low_owners2new_lows;
    push_down(
        mesh, d, d - 1, old_owners2new_ents, high2low, old_low_owners2new_lows);
    new_mesh.set_ents(d, high2low);
    new_ents2old_owners = old_owners2new_ents.invert();
    push_ents(
        mesh, &new_mesh, d, new_ents2old_owners, old_owners2new_ents, mode);
    old_owners2new_ents = old_low_owners2new_lows;
  }
  auto new_verts2old_owners = old_owners2new_ents.invert();
  auto nnew_verts = new_verts2old_owners.nitems();
  new_mesh.set_verts(nnew_verts);
  push_ents(
      mesh, &new_mesh, VERT, new_verts2old_owners, old_owners2new_ents, mode);
  *mesh = new_mesh;
  for (Int d = 0; d <= mesh->dim(); ++d) {
    OMEGA_H_CHECK(mesh->has_tag(d, "global"));
  }
}